

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::FinalizeTargetCompileInfo(cmGlobalGenerator *this)

{
  cmTarget *this_00;
  cmMakefile *this_01;
  undefined8 uVar1;
  pointer pbVar2;
  PolicyStatus PVar3;
  pointer ppcVar4;
  char *value;
  long *plVar5;
  string *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Hash_node_base *p_Var8;
  pointer __rhs;
  cmListFileBacktrace *bt;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  cmStringRange cVar9;
  cmBacktraceRange cVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string standardIncludesVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardIncludesSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string *local_c8;
  string local_c0;
  size_type *local_a0;
  undefined8 local_98;
  pointer local_90;
  pointer local_88;
  cmListFileBacktrace *local_80;
  string *local_78;
  _Alloc_node local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  cmState::GetEnabledLanguages_abi_cxx11_(&local_68,this->CMakeInstance->State);
  ppcVar4 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_90 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar4 != local_90) {
    do {
      this_01 = *ppcVar4;
      local_88 = ppcVar4;
      cVar9 = cmMakefile::GetCompileDefinitionsEntries_abi_cxx11_(this_01);
      local_c8 = (string *)cVar9.End._M_current;
      local_78 = (string *)cVar9.Begin._M_current;
      cVar10 = cmMakefile::GetCompileDefinitionsBacktraces(this_01);
      local_80 = (cmListFileBacktrace *)cVar10.Begin._M_current;
      for (p_Var8 = (this_01->Targets)._M_h._M_before_begin._M_nxt;
          pbVar2 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, p_Var8 != (_Hash_node_base *)0x0;
          p_Var8 = p_Var8->_M_nxt) {
        if (*(int *)&p_Var8[0x3a]._M_nxt != 6) {
          this_00 = (cmTarget *)(p_Var8 + 5);
          cmTarget::AppendBuildInterfaceIncludes(this_00);
          if (*(int *)&p_Var8[0x3a]._M_nxt != 7) {
            psVar6 = local_78;
            bt = local_80;
            if (local_78 != local_c8) {
              do {
                cmTarget::InsertCompileDefinition(this_00,psVar6,bt);
                psVar6 = psVar6 + 1;
                bt = bt + 1;
              } while (psVar6 != local_c8);
            }
            PVar3 = cmMakefile::GetPolicyStatus(this_01,CMP0043,false);
            if (PVar3 < NEW) {
              local_108._0_8_ = (string *)0x0;
              local_108._8_8_ = (string *)0x0;
              local_108._16_8_ = (pointer)0x0;
              cmMakefile::GetConfigurations
                        (&local_50,this_01,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_108,true);
              s = (string *)local_108._0_8_;
              psVar6 = (string *)local_108._8_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
                s = (string *)local_108._0_8_;
                psVar6 = (string *)local_108._8_8_;
              }
              for (; s != psVar6; s = s + 1) {
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c0,"COMPILE_DEFINITIONS_","");
                cmsys::SystemTools::UpperCase((string *)&local_e8,s);
                std::__cxx11::string::_M_append((char *)&local_c0,local_e8._M_allocated_capacity);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_allocated_capacity != &local_d8) {
                  operator_delete((void *)local_e8._M_allocated_capacity,
                                  local_d8._M_allocated_capacity + 1);
                }
                value = cmMakefile::GetProperty(this_01,&local_c0);
                cmTarget::AppendProperty(this_00,&local_c0,value,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_108);
            }
          }
        }
      }
      local_c0._M_string_length._0_4_ = 0;
      local_c0.field_2._M_allocated_capacity = 0;
      local_c0.field_2._8_8_ = &local_c0._M_string_length;
      local_98 = 0;
      local_a0 = (size_type *)local_c0.field_2._8_8_;
      for (__rhs = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar2; __rhs = __rhs + 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"CMAKE_",__rhs);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_108);
        local_e8._M_allocated_capacity = (size_type)&local_d8;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar7) {
          local_d8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_d8._8_8_ = plVar5[3];
        }
        else {
          local_d8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_e8._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar5;
        }
        local_e8._8_8_ = plVar5[1];
        *plVar5 = (long)paVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((string *)local_108._0_8_ != (string *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)&local_e8);
        local_108._0_8_ = (string *)0x0;
        local_108._8_8_ = (string *)0x0;
        local_108._16_8_ = (pointer)0x0;
        cmSystemTools::ExpandListArgument
                  (psVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_108,false);
        uVar1 = local_108._8_8_;
        local_70._M_t =
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0;
        for (__v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_108._0_8_;
            __v != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar1;
            __v = __v + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_c0,(const_iterator)&local_c0._M_string_length,__v,&local_70);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_allocated_capacity != &local_d8) {
          operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1)
          ;
        }
      }
      cmMakefile::AddSystemIncludeDirectories
                (this_01,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c0);
      ppcVar4 = local_88 + 1;
    } while (ppcVar4 != local_90);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void cmGlobalGenerator::FinalizeTargetCompileInfo()
{
  std::vector<std::string> const langs =
    this->CMakeInstance->GetState()->GetEnabledLanguages();

  // Construct per-target generator information.
  for (cmMakefile* mf : this->Makefiles) {
    const cmStringRange noconfig_compile_definitions =
      mf->GetCompileDefinitionsEntries();
    const cmBacktraceRange noconfig_compile_definitions_bts =
      mf->GetCompileDefinitionsBacktraces();

    cmTargets& targets = mf->GetTargets();
    for (auto& target : targets) {
      cmTarget* t = &target.second;
      if (t->GetType() == cmStateEnums::GLOBAL_TARGET) {
        continue;
      }

      t->AppendBuildInterfaceIncludes();

      if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }

      cmBacktraceRange::const_iterator btIt =
        noconfig_compile_definitions_bts.begin();
      for (cmStringRange::const_iterator it =
             noconfig_compile_definitions.begin();
           it != noconfig_compile_definitions.end(); ++it, ++btIt) {
        t->InsertCompileDefinition(*it, *btIt);
      }

      cmPolicies::PolicyStatus polSt =
        mf->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        std::vector<std::string> configs;
        mf->GetConfigurations(configs);

        for (std::string const& c : configs) {
          std::string defPropName = "COMPILE_DEFINITIONS_";
          defPropName += cmSystemTools::UpperCase(c);
          t->AppendProperty(defPropName, mf->GetProperty(defPropName));
        }
      }
    }

    // The standard include directories for each language
    // should be treated as system include directories.
    std::set<std::string> standardIncludesSet;
    for (std::string const& li : langs) {
      std::string const standardIncludesVar =
        "CMAKE_" + li + "_STANDARD_INCLUDE_DIRECTORIES";
      std::string const& standardIncludesStr =
        mf->GetSafeDefinition(standardIncludesVar);
      std::vector<std::string> standardIncludesVec;
      cmSystemTools::ExpandListArgument(standardIncludesStr,
                                        standardIncludesVec);
      standardIncludesSet.insert(standardIncludesVec.begin(),
                                 standardIncludesVec.end());
    }
    mf->AddSystemIncludeDirectories(standardIncludesSet);
  }
}